

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uo_refcount.c
# Opt level: O2

uo_refcount * uo_refcount_create(void *ptr,_func_void_void_ptr *finalizer)

{
  uo_refcount_linklist *puVar1;
  
  puVar1 = uo_refcount_linkpool_rent();
  (puVar1->item).count = 1;
  (puVar1->item).ptr = ptr;
  (puVar1->item).finalizer = finalizer;
  return &puVar1->item;
}

Assistant:

uo_refcount *uo_refcount_create(
    void *ptr,
    void (*finalizer)(void *))
{
    uo_refcount *refcount = &uo_refcount_linkpool_rent()->item;
    atomic_init(&refcount->count, 1);
    refcount->ptr = ptr;
    refcount->finalizer = finalizer;
    return refcount;
}